

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

void __thiscall ByteCodeGenerator::ProcessScopeWithCapturedSym(ByteCodeGenerator *this,Scope *scope)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  ScopeType SVar4;
  undefined4 *puVar5;
  FuncInfo *this_00;
  Scope *pSVar6;
  bool notCatch;
  FuncInfo *func;
  Scope *scope_local;
  ByteCodeGenerator *this_local;
  
  bVar2 = Scope::GetHasOwnLocalInClosure(scope);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0xc85,"(scope->GetHasOwnLocalInClosure())",
                       "scope->GetHasOwnLocalInClosure()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  this_00 = Scope::GetFunc(scope);
  SVar4 = Scope::GetScopeType(scope);
  bVar2 = false;
  if (SVar4 != ScopeType_Catch) {
    SVar4 = Scope::GetScopeType(scope);
    bVar2 = SVar4 != ScopeType_CatchParamPattern;
  }
  pSVar6 = FuncInfo::GetBodyScope(this_00);
  if (((scope == pSVar6) || (pSVar6 = FuncInfo::GetParamScope(this_00), scope == pSVar6)) ||
     ((bVar3 = Scope::GetCanMerge(scope), bVar3 && (bVar2)))) {
    FuncInfo::SetHasLocalInClosure(this_00,true);
  }
  else {
    bVar2 = Scope::HasCrossScopeFuncAssignment(scope);
    if (bVar2) {
      FuncInfo::SetHasMaybeEscapedNestedFunc(this_00,L"InstantiateScopeWithCrossScopeAssignment");
    }
    Scope::SetMustInstantiate(scope,true);
  }
  return;
}

Assistant:

void ByteCodeGenerator::ProcessScopeWithCapturedSym(Scope *scope)
{
    Assert(scope->GetHasOwnLocalInClosure());

    // (Note: if any catch var is closure-captured, we won't merge the catch scope with the function scope.
    // So don't mark the function scope "has local in closure".)
    FuncInfo *func = scope->GetFunc();
    bool notCatch = scope->GetScopeType() != ScopeType_Catch && scope->GetScopeType() != ScopeType_CatchParamPattern;
    if (scope == func->GetBodyScope() || scope == func->GetParamScope() || (scope->GetCanMerge() && notCatch))
    {
        func->SetHasLocalInClosure(true);
    }
    else
    {
        if (scope->HasCrossScopeFuncAssignment())
        {
            func->SetHasMaybeEscapedNestedFunc(DebugOnly(_u("InstantiateScopeWithCrossScopeAssignment")));
        }
        scope->SetMustInstantiate(true);
    }
}